

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O2

void __thiscall vkt::TestCaseExecutor::deinit(TestCaseExecutor *this,TestCase *param_1)

{
  ostringstream *this_00;
  DebugReportRecorder *pDVar1;
  ulong uVar2;
  TestContext *this_01;
  uint uVar3;
  ulong uVar4;
  Block *pBVar5;
  ulong uVar6;
  int numErrors;
  allocator<char> local_1f9;
  ulong local_1f8;
  TestLog *local_1f0;
  ScopedLogSection section;
  string local_1d0;
  MessageBuilder local_1b0;
  
  if (this->m_instance != (TestInstance *)0x0) {
    (*this->m_instance->_vptr_TestInstance[1])();
  }
  this->m_instance = (TestInstance *)0x0;
  pDVar1 = (this->m_debugReportRecorder).
           super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>.
           m_data.ptr;
  if (pDVar1 != (DebugReportRecorder *)0x0) {
    local_1f0 = ((this->m_context).m_testCtx)->m_log;
    if (((pDVar1->m_messages).m_first != (pDVar1->m_messages).m_last) ||
       ((pDVar1->m_messages).m_numElements % (pDVar1->m_messages).m_blockSize != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"DebugMessages",(allocator<char> *)&numErrors);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"Debug Messages",&local_1f9);
      tcu::ScopedLogSection::ScopedLogSection(&section,local_1f0,(string *)&local_1b0,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      numErrors = 0;
      uVar2 = (pDVar1->m_messages).m_blockSize;
      pBVar5 = (pDVar1->m_messages).m_first;
      local_1f8 = 0;
      this_00 = &local_1b0.m_str;
      uVar6 = 0;
      uVar4 = uVar2;
      while ((pBVar5 != (pDVar1->m_messages).m_last ||
             (uVar6 != (pDVar1->m_messages).m_numElements % uVar4))) {
        uVar3 = pBVar5->elements[uVar6].flags;
        if ((uVar3 & 0xe) != 0) {
          local_1b0.m_log = local_1f0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          ::vk::operator<<((ostream *)this_00,pBVar5->elements + uVar6);
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          uVar3 = pBVar5->elements[uVar6].flags;
        }
        if ((uVar3 & 8) != 0) {
          numErrors = (int)local_1f8 + 1;
          local_1f8 = (ulong)(uint)numErrors;
        }
        uVar6 = uVar6 + 1;
        if (uVar6 == uVar2) {
          pBVar5 = pBVar5->next;
          uVar6 = 0;
        }
        uVar4 = (pDVar1->m_messages).m_blockSize;
      }
      de::AppendList<vk::DebugReportMessage>::clear
                (&((this->m_debugReportRecorder).
                   super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
                   .m_data.ptr)->m_messages);
      if (0 < (int)local_1f8) {
        this_01 = (this->m_context).m_testCtx;
        de::toString<int>(&local_1d0,&numErrors);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,&local_1d0," API usage errors found");
        tcu::TestContext::setTestResult
                  (this_01,QP_TEST_RESULT_INTERNAL_ERROR,(char *)local_1b0.m_log);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
    }
  }
  return;
}

Assistant:

void TestCaseExecutor::deinit (tcu::TestCase*)
{
	delete m_instance;
	m_instance = DE_NULL;

	// Collect and report any debug messages
	if (m_debugReportRecorder)
	{
		// \note We are not logging INFORMATION and DEBUG messages
		static const vk::VkDebugReportFlagsEXT			errorFlags		= vk::VK_DEBUG_REPORT_ERROR_BIT_EXT;
		static const vk::VkDebugReportFlagsEXT			logFlags		= errorFlags
																		| vk::VK_DEBUG_REPORT_WARNING_BIT_EXT
																		| vk::VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT;

		typedef vk::DebugReportRecorder::MessageList	DebugMessages;

		const DebugMessages&	messages	= m_debugReportRecorder->getMessages();
		tcu::TestLog&			log			= m_context.getTestContext().getLog();

		if (messages.begin() != messages.end())
		{
			const tcu::ScopedLogSection	section		(log, "DebugMessages", "Debug Messages");
			int							numErrors	= 0;

			for (DebugMessages::const_iterator curMsg = messages.begin(); curMsg != messages.end(); ++curMsg)
			{
				if ((curMsg->flags & logFlags) != 0)
					log << tcu::TestLog::Message << *curMsg << tcu::TestLog::EndMessage;

				if ((curMsg->flags & errorFlags) != 0)
					numErrors += 1;
			}

			m_debugReportRecorder->clearMessages();

			if (numErrors > 0)
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, (de::toString(numErrors) + " API usage errors found").c_str());
		}
	}
}